

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Opt *pOVar1;
  Arg *other;
  allocator<char> local_2a81;
  string local_2a80;
  allocator<char> local_2a59;
  string local_2a58;
  ParserRefImpl<Catch::clara::detail::Arg> local_2a38;
  allocator<char> local_29d1;
  string local_29d0;
  allocator<char> local_29a9;
  string local_29a8;
  allocator<char> local_2981;
  string local_2980;
  Opt local_2960;
  allocator<char> local_28e1;
  string local_28e0;
  allocator<char> local_28b9;
  string local_28b8;
  Opt local_2898;
  allocator<char> local_2819;
  string local_2818;
  allocator<char> local_27f1;
  string local_27f0;
  allocator<char> local_27c9;
  string local_27c8;
  Opt local_27a8;
  allocator<char> local_2729;
  string local_2728;
  allocator<char> local_2701;
  string local_2700;
  allocator<char> local_26d9;
  string local_26d8;
  Opt local_26b8;
  allocator<char> local_2639;
  string local_2638;
  allocator<char> local_2611;
  string local_2610;
  allocator<char> local_25e9;
  string local_25e8;
  Opt local_25c8;
  allocator<char> local_2549;
  string local_2548;
  allocator<char> local_2521;
  string local_2520;
  allocator<char> local_24f9;
  string local_24f8;
  Opt local_24d8;
  allocator<char> local_2459;
  string local_2458;
  allocator<char> local_2431;
  string local_2430;
  Opt local_2410;
  allocator<char> local_2391;
  string local_2390;
  allocator<char> local_2369;
  string local_2368;
  allocator<char> local_2341;
  string local_2340;
  Opt local_2320;
  allocator<char> local_22a1;
  string local_22a0;
  allocator<char> local_2279;
  string local_2278;
  allocator<char> local_2251;
  string local_2250;
  Opt local_2230;
  allocator<char> local_21b1;
  string local_21b0;
  allocator<char> local_2189;
  string local_2188;
  allocator<char> local_2161;
  string local_2160;
  Opt local_2140;
  allocator<char> local_20c1;
  string local_20c0;
  allocator<char> local_2099;
  string local_2098;
  Opt local_2078;
  allocator<char> local_1ff9;
  string local_1ff8;
  allocator<char> local_1fd1;
  string local_1fd0;
  Opt local_1fb0;
  allocator<char> local_1f31;
  string local_1f30;
  allocator<char> local_1f09;
  string local_1f08;
  allocator<char> local_1ee1;
  string local_1ee0;
  allocator<char> local_1eb9;
  string local_1eb8;
  Opt local_1e98;
  allocator<char> local_1e19;
  string local_1e18;
  allocator<char> local_1df1;
  string local_1df0;
  allocator<char> local_1dc9;
  string local_1dc8;
  allocator<char> local_1da1;
  string local_1da0;
  Opt local_1d80;
  allocator<char> local_1d01;
  string local_1d00;
  allocator<char> local_1cd9;
  string local_1cd8;
  allocator<char> local_1cb1;
  string local_1cb0;
  Opt local_1c90;
  allocator<char> local_1c11;
  string local_1c10;
  allocator<char> local_1be9;
  string local_1be8;
  allocator<char> local_1bc1;
  string local_1bc0;
  allocator<char> local_1b99;
  string local_1b98;
  Opt local_1b78;
  allocator<char> local_1af9;
  string local_1af8;
  allocator<char> local_1ad1;
  string local_1ad0;
  allocator<char> local_1aa9;
  string local_1aa8;
  allocator<char> local_1a81;
  string local_1a80;
  Opt local_1a60;
  allocator<char> local_19e1;
  string local_19e0;
  allocator<char> local_19b9;
  string local_19b8;
  allocator<char> local_1991;
  string local_1990;
  allocator<char> local_1969;
  string local_1968;
  anon_class_8_1_50637480_for_m_lambda local_1948;
  Opt local_1940;
  allocator<char> local_18c1;
  string local_18c0;
  allocator<char> local_1899;
  string local_1898;
  allocator<char> local_1871;
  string local_1870;
  allocator<char> local_1849;
  string local_1848;
  Opt local_1828;
  allocator<char> local_17a9;
  string local_17a8;
  allocator<char> local_1781;
  string local_1780;
  allocator<char> local_1759;
  string local_1758;
  allocator<char> local_1731;
  string local_1730;
  anon_class_8_1_50637480_for_m_lambda local_1710;
  Opt local_1708;
  allocator<char> local_1689;
  string local_1688;
  allocator<char> local_1661;
  string local_1660;
  allocator<char> local_1639;
  string local_1638;
  anon_class_8_1_50637480_for_m_lambda local_1618;
  Opt local_1610;
  allocator<char> local_1591;
  string local_1590;
  allocator<char> local_1569;
  string local_1568;
  allocator<char> local_1541;
  string local_1540;
  allocator<char> local_1519;
  string local_1518;
  Opt local_14f8;
  allocator<char> local_1479;
  string local_1478;
  allocator<char> local_1451;
  string local_1450;
  allocator<char> local_1429;
  string local_1428;
  allocator<char> local_1401;
  string local_1400;
  Opt local_13e0;
  allocator<char> local_1361;
  string local_1360;
  allocator<char> local_1339;
  string local_1338;
  allocator<char> local_1311;
  string local_1310;
  allocator<char> local_12e9;
  string local_12e8;
  Opt local_12c8;
  allocator<char> local_1249;
  string local_1248;
  allocator<char> local_1221;
  string local_1220;
  allocator<char> local_11f9;
  string local_11f8;
  Opt local_11d8;
  allocator<char> local_1159;
  string local_1158;
  allocator<char> local_1131;
  string local_1130;
  allocator<char> local_1109;
  string local_1108;
  Opt local_10e8;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  allocator<char> local_1019;
  string local_1018;
  Opt local_ff8;
  allocator<char> local_f79;
  string local_f78;
  allocator<char> local_f51;
  string local_f50;
  allocator<char> local_f29;
  string local_f28;
  Opt local_f08;
  allocator<char> local_e89;
  string local_e88;
  allocator<char> local_e61;
  string local_e60;
  allocator<char> local_e39;
  string local_e38;
  Opt local_e18;
  allocator<char> local_d99;
  string local_d98;
  allocator<char> local_d71;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  Opt local_d28;
  Help local_ca0;
  ExeName local_c28;
  Parser local_c00;
  Parser local_ba0;
  Parser local_b40;
  Parser local_ae0;
  Parser local_a80;
  Parser local_a20;
  Parser local_9c0;
  Parser local_960;
  Parser local_900;
  Parser local_8a0;
  Parser local_840;
  Parser local_7e0;
  Parser local_780;
  Parser local_720;
  Parser local_6c0;
  Parser local_660;
  Parser local_600;
  Parser local_5a0;
  Parser local_540;
  Parser local_4e0;
  Parser local_480;
  Parser local_420;
  Parser local_3c0;
  Parser local_360;
  Parser local_300;
  Parser local_2a0;
  Parser local_240;
  Parser local_1e0;
  Parser local_180;
  Parser local_120;
  Parser local_c0;
  undefined1 local_59;
  anon_class_8_1_50637480_for_m_lambda local_58;
  anon_class_8_1_50637480_for_m_lambda setReporter;
  anon_class_8_1_50637480_for_m_lambda setVerbosity;
  anon_class_8_1_50637480_for_m_lambda setWaitForKeypress;
  anon_class_8_1_50637480_for_m_lambda setColourUsage;
  anon_class_8_1_50637480_for_m_lambda setRngSeed;
  anon_class_8_1_50637480_for_m_lambda setTestOrder;
  anon_class_8_1_50637480_for_m_lambda loadTestNamesFromFile;
  anon_class_8_1_50637480_for_m_lambda setWarning;
  ConfigData *config_local;
  Parser *cli;
  
  local_59 = 0;
  local_58.config = config;
  setReporter.config = config;
  setVerbosity.config = config;
  setWaitForKeypress.config = config;
  setColourUsage.config = config;
  setRngSeed.config = config;
  setTestOrder.config = config;
  loadTestNamesFromFile.config = config;
  clara::detail::ExeName::ExeName(&local_c28,&config->processName);
  clara::detail::Help::Help(&local_ca0,&config->showHelp);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (&local_c00,&local_c28.super_ComposableParserImpl<Catch::clara::detail::ExeName>,
             &local_ca0);
  clara::detail::Opt::Opt(&local_d28,&config->listTests);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,"-l",&local_d49);
  pOVar1 = clara::detail::Opt::operator[](&local_d28,&local_d48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d70,"--list-tests",&local_d71)
  ;
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_d70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d98,"list all/matching test cases",&local_d99);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_d98);
  clara::detail::Parser::operator|(&local_ba0,&local_c00,pOVar1);
  clara::detail::Opt::Opt(&local_e18,&config->listTags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e38,"-t",&local_e39);
  pOVar1 = clara::detail::Opt::operator[](&local_e18,&local_e38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e60,"--list-tags",&local_e61);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_e60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e88,"list all/matching tags",&local_e89);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_e88);
  clara::detail::Parser::operator|(&local_b40,&local_ba0,pOVar1);
  clara::detail::Opt::Opt(&local_f08,&config->showSuccessfulTests);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f28,"-s",&local_f29);
  pOVar1 = clara::detail::Opt::operator[](&local_f08,&local_f28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f50,"--success",&local_f51);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_f50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f78,"include successful tests in output",&local_f79);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_f78);
  clara::detail::Parser::operator|(&local_ae0,&local_b40,pOVar1);
  clara::detail::Opt::Opt(&local_ff8,&config->shouldDebugBreak);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1018,"-b",&local_1019);
  pOVar1 = clara::detail::Opt::operator[](&local_ff8,&local_1018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1040,"--break",&local_1041);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1040);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"break into debugger on failure",&local_1069);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1068);
  clara::detail::Parser::operator|(&local_a80,&local_ae0,pOVar1);
  clara::detail::Opt::Opt(&local_10e8,&config->noThrow);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1108,"-e",&local_1109);
  pOVar1 = clara::detail::Opt::operator[](&local_10e8,&local_1108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1130,"--nothrow",&local_1131);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1158,"skip exception tests",&local_1159);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1158);
  clara::detail::Parser::operator|(&local_a20,&local_a80,pOVar1);
  clara::detail::Opt::Opt(&local_11d8,&config->showInvisibles);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11f8,"-i",&local_11f9);
  pOVar1 = clara::detail::Opt::operator[](&local_11d8,&local_11f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1220,"--invisibles",&local_1221);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1248,"show invisibles (tabs, newlines)",&local_1249);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1248);
  clara::detail::Parser::operator|(&local_9c0,&local_a20,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"filename",&local_12e9);
  clara::detail::Opt::Opt<std::__cxx11::string>(&local_12c8,&config->outputFilename,&local_12e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1310,"-o",&local_1311);
  pOVar1 = clara::detail::Opt::operator[](&local_12c8,&local_1310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1338,"--out",&local_1339);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1360,"output filename",&local_1361);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1360);
  clara::detail::Parser::operator|(&local_960,&local_9c0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1400,"name",&local_1401);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__0>
            (&local_13e0,&local_58,&local_1400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1428,"-r",&local_1429);
  pOVar1 = clara::detail::Opt::operator[](&local_13e0,&local_1428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1450,"--reporter",&local_1451)
  ;
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1478,"reporter to use (defaults to console)",&local_1479);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1478);
  clara::detail::Parser::operator|(&local_900,&local_960,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1518,"name",&local_1519);
  clara::detail::Opt::Opt<std::__cxx11::string>(&local_14f8,&config->name,&local_1518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1540,"-n",&local_1541);
  pOVar1 = clara::detail::Opt::operator[](&local_14f8,&local_1540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1568,"--name",&local_1569);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1590,"suite name",&local_1591)
  ;
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1590);
  clara::detail::Parser::operator|(&local_8a0,&local_900,pOVar1);
  local_1618.config = config;
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__1>
            (&local_1610,&local_1618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1638,"-a",&local_1639);
  pOVar1 = clara::detail::Opt::operator[](&local_1610,&local_1638);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1660,"--abort",&local_1661);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1660);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1688,"abort at first failure",&local_1689);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1688);
  clara::detail::Parser::operator|(&local_840,&local_8a0,pOVar1);
  local_1710.config = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1730,"no. failures",&local_1731);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
            (&local_1708,&local_1710,&local_1730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1758,"-x",&local_1759);
  pOVar1 = clara::detail::Opt::operator[](&local_1708,&local_1758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1780,"--abortx",&local_1781);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1780);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17a8,"abort after x failures",&local_17a9);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_17a8);
  clara::detail::Parser::operator|(&local_7e0,&local_840,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1848,"warning name",&local_1849);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
            (&local_1828,(anon_class_8_1_50637480_for_m_lambda *)&loadTestNamesFromFile,&local_1848)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1870,"-w",&local_1871);
  pOVar1 = clara::detail::Opt::operator[](&local_1828,&local_1870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1898,"--warn",&local_1899);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18c0,"enable warnings",&local_18c1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_18c0);
  clara::detail::Parser::operator|(&local_780,&local_7e0,pOVar1);
  local_1948.config = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1968,"yes|no",&local_1969);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__4>
            (&local_1940,&local_1948,&local_1968);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1990,"-d",&local_1991);
  pOVar1 = clara::detail::Opt::operator[](&local_1940,&local_1990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19b8,"--durations",&local_19b9);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_19b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19e0,"show test durations",&local_19e1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_19e0);
  clara::detail::Parser::operator|(&local_720,&local_780,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a80,"seconds",&local_1a81);
  clara::detail::Opt::Opt<double>(&local_1a60,&config->minDuration,&local_1a80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1aa8,"-D",&local_1aa9);
  pOVar1 = clara::detail::Opt::operator[](&local_1a60,&local_1aa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,"--min-duration",&local_1ad1);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1ad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1af8,
             "show test durations for tests taking at least the given number of seconds",&local_1af9
            );
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1af8);
  clara::detail::Parser::operator|(&local_6c0,&local_720,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b98,"filename",&local_1b99);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>
            (&local_1b78,(anon_class_8_1_50637480_for_m_lambda *)&setTestOrder,&local_1b98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1bc0,"-f",&local_1bc1);
  pOVar1 = clara::detail::Opt::operator[](&local_1b78,&local_1bc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1be8,"--input-file",&local_1be9);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1be8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c10,"load test names to run from a file",&local_1c11);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1c10);
  clara::detail::Parser::operator|(&local_660,&local_6c0,pOVar1);
  clara::detail::Opt::Opt(&local_1c90,&config->filenamesAsTags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1cb0,"-#",&local_1cb1);
  pOVar1 = clara::detail::Opt::operator[](&local_1c90,&local_1cb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1cd8,"--filenames-as-tags",&local_1cd9);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1cd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d00,"adds a tag for the filename",&local_1d01);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1d00);
  clara::detail::Parser::operator|(&local_600,&local_660,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1da0,"section name",&local_1da1);
  clara::detail::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_1d80,&config->sectionsToRun,&local_1da0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1dc8,"-c",&local_1dc9);
  pOVar1 = clara::detail::Opt::operator[](&local_1d80,&local_1dc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1df0,"--section",&local_1df1);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e18,"specify section to run",&local_1e19);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1e18);
  clara::detail::Parser::operator|(&local_5a0,&local_600,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1eb8,"quiet|normal|high",&local_1eb9);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__6>
            (&local_1e98,(anon_class_8_1_50637480_for_m_lambda *)&setReporter,&local_1eb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ee0,"-v",&local_1ee1);
  pOVar1 = clara::detail::Opt::operator[](&local_1e98,&local_1ee0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f08,"--verbosity",&local_1f09);
  pOVar1 = clara::detail::Opt::operator[](pOVar1,&local_1f08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f30,"set output verbosity",&local_1f31);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1f30);
  clara::detail::Parser::operator|(&local_540,&local_5a0,pOVar1);
  clara::detail::Opt::Opt(&local_1fb0,&config->listTestNamesOnly);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fd0,"--list-test-names-only",&local_1fd1);
  pOVar1 = clara::detail::Opt::operator[](&local_1fb0,&local_1fd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ff8,"list all/matching test cases names only",&local_1ff9);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_1ff8);
  clara::detail::Parser::operator|(&local_4e0,&local_540,pOVar1);
  clara::detail::Opt::Opt(&local_2078,&config->listReporters);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2098,"--list-reporters",&local_2099);
  pOVar1 = clara::detail::Opt::operator[](&local_2078,&local_2098);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20c0,"list all reporters",&local_20c1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_20c0);
  clara::detail::Parser::operator|(&local_480,&local_4e0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2160,"decl|lex|rand",&local_2161);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__7>
            (&local_2140,(anon_class_8_1_50637480_for_m_lambda *)&setRngSeed,&local_2160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2188,"--order",&local_2189);
  pOVar1 = clara::detail::Opt::operator[](&local_2140,&local_2188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21b0,"test case order (defaults to decl)",&local_21b1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_21b0);
  clara::detail::Parser::operator|(&local_420,&local_480,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2250,"\'time\'|number",&local_2251);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__8>
            (&local_2230,(anon_class_8_1_50637480_for_m_lambda *)&setColourUsage,&local_2250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2278,"--rng-seed",&local_2279)
  ;
  pOVar1 = clara::detail::Opt::operator[](&local_2230,&local_2278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_22a0,"set a specific seed for random numbers",&local_22a1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_22a0);
  clara::detail::Parser::operator|(&local_3c0,&local_420,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2340,"yes|no",&local_2341);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__9>
            (&local_2320,(anon_class_8_1_50637480_for_m_lambda *)&setWaitForKeypress,&local_2340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2368,"--use-colour",&local_2369);
  pOVar1 = clara::detail::Opt::operator[](&local_2320,&local_2368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2390,"should output be colourised",&local_2391);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_2390);
  clara::detail::Parser::operator|(&local_360,&local_3c0,pOVar1);
  clara::detail::Opt::Opt(&local_2410,&config->libIdentify);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2430,"--libidentify",&local_2431);
  pOVar1 = clara::detail::Opt::operator[](&local_2410,&local_2430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2458,"report name and version according to libidentify standard",
             &local_2459);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_2458);
  clara::detail::Parser::operator|(&local_300,&local_360,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24f8,"never|start|exit|both",&local_24f9);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__10>
            (&local_24d8,(anon_class_8_1_50637480_for_m_lambda *)&setVerbosity,&local_24f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2520,"--wait-for-keypress",&local_2521);
  pOVar1 = clara::detail::Opt::operator[](&local_24d8,&local_2520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2548,"waits for a keypress before exiting",&local_2549);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_2548);
  clara::detail::Parser::operator|(&local_2a0,&local_300,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_25e8,"samples",&local_25e9);
  clara::detail::Opt::Opt<unsigned_int>(&local_25c8,&config->benchmarkSamples,&local_25e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2610,"--benchmark-samples",&local_2611);
  pOVar1 = clara::detail::Opt::operator[](&local_25c8,&local_2610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2638,"number of samples to collect (default: 100)",&local_2639);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_2638);
  clara::detail::Parser::operator|(&local_240,&local_2a0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_26d8,"resamples",&local_26d9);
  clara::detail::Opt::Opt<unsigned_int>(&local_26b8,&config->benchmarkResamples,&local_26d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2700,"--benchmark-resamples",&local_2701);
  pOVar1 = clara::detail::Opt::operator[](&local_26b8,&local_2700);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2728,"number of resamples for the bootstrap (default: 100000)",
             &local_2729);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_2728);
  clara::detail::Parser::operator|(&local_1e0,&local_240,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27c8,"confidence interval",&local_27c9);
  clara::detail::Opt::Opt<double>(&local_27a8,&config->benchmarkConfidenceInterval,&local_27c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27f0,"--benchmark-confidence-interval",&local_27f1);
  pOVar1 = clara::detail::Opt::operator[](&local_27a8,&local_27f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2818,
             "confidence interval for the bootstrap (between 0 and 1, default: 0.95)",&local_2819);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_2818);
  clara::detail::Parser::operator|(&local_180,&local_1e0,pOVar1);
  clara::detail::Opt::Opt(&local_2898,&config->benchmarkNoAnalysis);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28b8,"--benchmark-no-analysis",&local_28b9);
  pOVar1 = clara::detail::Opt::operator[](&local_2898,&local_28b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28e0,"perform only measurements; do not perform any analysis",
             &local_28e1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_28e0);
  clara::detail::Parser::operator|(&local_120,&local_180,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2980,"benchmarkWarmupTime",&local_2981);
  clara::detail::Opt::Opt<long>(&local_2960,&config->benchmarkWarmupTime,&local_2980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29a8,"--benchmark-warmup-time",&local_29a9);
  pOVar1 = clara::detail::Opt::operator[](&local_2960,&local_29a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29d0,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_29d1);
  pOVar1 = clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_29d0);
  clara::detail::Parser::operator|(&local_c0,&local_120,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a58,"test name|pattern|tags",&local_2a59);
  clara::detail::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>>
            ((Arg *)&local_2a38,&config->testsOrTags,&local_2a58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a80,"which test or tests to use",&local_2a81);
  other = clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::operator()
                    (&local_2a38,&local_2a80);
  clara::detail::Parser::operator|(__return_storage_ptr__,&local_c0,other);
  std::__cxx11::string::~string((string *)&local_2a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a81);
  clara::detail::Arg::~Arg((Arg *)&local_2a38);
  std::__cxx11::string::~string((string *)&local_2a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a59);
  clara::detail::Parser::~Parser(&local_c0);
  std::__cxx11::string::~string((string *)&local_29d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_29d1);
  std::__cxx11::string::~string((string *)&local_29a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_29a9);
  clara::detail::Opt::~Opt(&local_2960);
  std::__cxx11::string::~string((string *)&local_2980);
  std::allocator<char>::~allocator((allocator<char> *)&local_2981);
  clara::detail::Parser::~Parser(&local_120);
  std::__cxx11::string::~string((string *)&local_28e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28e1);
  std::__cxx11::string::~string((string *)&local_28b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_28b9);
  clara::detail::Opt::~Opt(&local_2898);
  clara::detail::Parser::~Parser(&local_180);
  std::__cxx11::string::~string((string *)&local_2818);
  std::allocator<char>::~allocator((allocator<char> *)&local_2819);
  std::__cxx11::string::~string((string *)&local_27f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27f1);
  clara::detail::Opt::~Opt(&local_27a8);
  std::__cxx11::string::~string((string *)&local_27c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c9);
  clara::detail::Parser::~Parser(&local_1e0);
  std::__cxx11::string::~string((string *)&local_2728);
  std::allocator<char>::~allocator((allocator<char> *)&local_2729);
  std::__cxx11::string::~string((string *)&local_2700);
  std::allocator<char>::~allocator((allocator<char> *)&local_2701);
  clara::detail::Opt::~Opt(&local_26b8);
  std::__cxx11::string::~string((string *)&local_26d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_26d9);
  clara::detail::Parser::~Parser(&local_240);
  std::__cxx11::string::~string((string *)&local_2638);
  std::allocator<char>::~allocator((allocator<char> *)&local_2639);
  std::__cxx11::string::~string((string *)&local_2610);
  std::allocator<char>::~allocator((allocator<char> *)&local_2611);
  clara::detail::Opt::~Opt(&local_25c8);
  std::__cxx11::string::~string((string *)&local_25e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_25e9);
  clara::detail::Parser::~Parser(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2548);
  std::allocator<char>::~allocator((allocator<char> *)&local_2549);
  std::__cxx11::string::~string((string *)&local_2520);
  std::allocator<char>::~allocator((allocator<char> *)&local_2521);
  clara::detail::Opt::~Opt(&local_24d8);
  std::__cxx11::string::~string((string *)&local_24f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_24f9);
  clara::detail::Parser::~Parser(&local_300);
  std::__cxx11::string::~string((string *)&local_2458);
  std::allocator<char>::~allocator((allocator<char> *)&local_2459);
  std::__cxx11::string::~string((string *)&local_2430);
  std::allocator<char>::~allocator((allocator<char> *)&local_2431);
  clara::detail::Opt::~Opt(&local_2410);
  clara::detail::Parser::~Parser(&local_360);
  std::__cxx11::string::~string((string *)&local_2390);
  std::allocator<char>::~allocator((allocator<char> *)&local_2391);
  std::__cxx11::string::~string((string *)&local_2368);
  std::allocator<char>::~allocator((allocator<char> *)&local_2369);
  clara::detail::Opt::~Opt(&local_2320);
  std::__cxx11::string::~string((string *)&local_2340);
  std::allocator<char>::~allocator((allocator<char> *)&local_2341);
  clara::detail::Parser::~Parser(&local_3c0);
  std::__cxx11::string::~string((string *)&local_22a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a1);
  std::__cxx11::string::~string((string *)&local_2278);
  std::allocator<char>::~allocator((allocator<char> *)&local_2279);
  clara::detail::Opt::~Opt(&local_2230);
  std::__cxx11::string::~string((string *)&local_2250);
  std::allocator<char>::~allocator((allocator<char> *)&local_2251);
  clara::detail::Parser::~Parser(&local_420);
  std::__cxx11::string::~string((string *)&local_21b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b1);
  std::__cxx11::string::~string((string *)&local_2188);
  std::allocator<char>::~allocator((allocator<char> *)&local_2189);
  clara::detail::Opt::~Opt(&local_2140);
  std::__cxx11::string::~string((string *)&local_2160);
  std::allocator<char>::~allocator((allocator<char> *)&local_2161);
  clara::detail::Parser::~Parser(&local_480);
  std::__cxx11::string::~string((string *)&local_20c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c1);
  std::__cxx11::string::~string((string *)&local_2098);
  std::allocator<char>::~allocator((allocator<char> *)&local_2099);
  clara::detail::Opt::~Opt(&local_2078);
  clara::detail::Parser::~Parser(&local_4e0);
  std::__cxx11::string::~string((string *)&local_1ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ff9);
  std::__cxx11::string::~string((string *)&local_1fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fd1);
  clara::detail::Opt::~Opt(&local_1fb0);
  clara::detail::Parser::~Parser(&local_540);
  std::__cxx11::string::~string((string *)&local_1f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f31);
  std::__cxx11::string::~string((string *)&local_1f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f09);
  std::__cxx11::string::~string((string *)&local_1ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ee1);
  clara::detail::Opt::~Opt(&local_1e98);
  std::__cxx11::string::~string((string *)&local_1eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb9);
  clara::detail::Parser::~Parser(&local_5a0);
  std::__cxx11::string::~string((string *)&local_1e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e19);
  std::__cxx11::string::~string((string *)&local_1df0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1df1);
  std::__cxx11::string::~string((string *)&local_1dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dc9);
  clara::detail::Opt::~Opt(&local_1d80);
  std::__cxx11::string::~string((string *)&local_1da0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1da1);
  clara::detail::Parser::~Parser(&local_600);
  std::__cxx11::string::~string((string *)&local_1d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d01);
  std::__cxx11::string::~string((string *)&local_1cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cd9);
  std::__cxx11::string::~string((string *)&local_1cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cb1);
  clara::detail::Opt::~Opt(&local_1c90);
  clara::detail::Parser::~Parser(&local_660);
  std::__cxx11::string::~string((string *)&local_1c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c11);
  std::__cxx11::string::~string((string *)&local_1be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be9);
  std::__cxx11::string::~string((string *)&local_1bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc1);
  clara::detail::Opt::~Opt(&local_1b78);
  std::__cxx11::string::~string((string *)&local_1b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b99);
  clara::detail::Parser::~Parser(&local_6c0);
  std::__cxx11::string::~string((string *)&local_1af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1af9);
  std::__cxx11::string::~string((string *)&local_1ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ad1);
  std::__cxx11::string::~string((string *)&local_1aa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1aa9);
  clara::detail::Opt::~Opt(&local_1a60);
  std::__cxx11::string::~string((string *)&local_1a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a81);
  clara::detail::Parser::~Parser(&local_720);
  std::__cxx11::string::~string((string *)&local_19e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19e1);
  std::__cxx11::string::~string((string *)&local_19b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b9);
  std::__cxx11::string::~string((string *)&local_1990);
  std::allocator<char>::~allocator((allocator<char> *)&local_1991);
  clara::detail::Opt::~Opt(&local_1940);
  std::__cxx11::string::~string((string *)&local_1968);
  std::allocator<char>::~allocator((allocator<char> *)&local_1969);
  clara::detail::Parser::~Parser(&local_780);
  std::__cxx11::string::~string((string *)&local_18c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18c1);
  std::__cxx11::string::~string((string *)&local_1898);
  std::allocator<char>::~allocator((allocator<char> *)&local_1899);
  std::__cxx11::string::~string((string *)&local_1870);
  std::allocator<char>::~allocator((allocator<char> *)&local_1871);
  clara::detail::Opt::~Opt(&local_1828);
  std::__cxx11::string::~string((string *)&local_1848);
  std::allocator<char>::~allocator((allocator<char> *)&local_1849);
  clara::detail::Parser::~Parser(&local_7e0);
  std::__cxx11::string::~string((string *)&local_17a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a9);
  std::__cxx11::string::~string((string *)&local_1780);
  std::allocator<char>::~allocator((allocator<char> *)&local_1781);
  std::__cxx11::string::~string((string *)&local_1758);
  std::allocator<char>::~allocator((allocator<char> *)&local_1759);
  clara::detail::Opt::~Opt(&local_1708);
  std::__cxx11::string::~string((string *)&local_1730);
  std::allocator<char>::~allocator((allocator<char> *)&local_1731);
  clara::detail::Parser::~Parser(&local_840);
  std::__cxx11::string::~string((string *)&local_1688);
  std::allocator<char>::~allocator((allocator<char> *)&local_1689);
  std::__cxx11::string::~string((string *)&local_1660);
  std::allocator<char>::~allocator((allocator<char> *)&local_1661);
  std::__cxx11::string::~string((string *)&local_1638);
  std::allocator<char>::~allocator((allocator<char> *)&local_1639);
  clara::detail::Opt::~Opt(&local_1610);
  clara::detail::Parser::~Parser(&local_8a0);
  std::__cxx11::string::~string((string *)&local_1590);
  std::allocator<char>::~allocator((allocator<char> *)&local_1591);
  std::__cxx11::string::~string((string *)&local_1568);
  std::allocator<char>::~allocator((allocator<char> *)&local_1569);
  std::__cxx11::string::~string((string *)&local_1540);
  std::allocator<char>::~allocator((allocator<char> *)&local_1541);
  clara::detail::Opt::~Opt(&local_14f8);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator((allocator<char> *)&local_1519);
  clara::detail::Parser::~Parser(&local_900);
  std::__cxx11::string::~string((string *)&local_1478);
  std::allocator<char>::~allocator((allocator<char> *)&local_1479);
  std::__cxx11::string::~string((string *)&local_1450);
  std::allocator<char>::~allocator((allocator<char> *)&local_1451);
  std::__cxx11::string::~string((string *)&local_1428);
  std::allocator<char>::~allocator((allocator<char> *)&local_1429);
  clara::detail::Opt::~Opt(&local_13e0);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator((allocator<char> *)&local_1401);
  clara::detail::Parser::~Parser(&local_960);
  std::__cxx11::string::~string((string *)&local_1360);
  std::allocator<char>::~allocator((allocator<char> *)&local_1361);
  std::__cxx11::string::~string((string *)&local_1338);
  std::allocator<char>::~allocator((allocator<char> *)&local_1339);
  std::__cxx11::string::~string((string *)&local_1310);
  std::allocator<char>::~allocator((allocator<char> *)&local_1311);
  clara::detail::Opt::~Opt(&local_12c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12e9);
  clara::detail::Parser::~Parser(&local_9c0);
  std::__cxx11::string::~string((string *)&local_1248);
  std::allocator<char>::~allocator((allocator<char> *)&local_1249);
  std::__cxx11::string::~string((string *)&local_1220);
  std::allocator<char>::~allocator((allocator<char> *)&local_1221);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f9);
  clara::detail::Opt::~Opt(&local_11d8);
  clara::detail::Parser::~Parser(&local_a20);
  std::__cxx11::string::~string((string *)&local_1158);
  std::allocator<char>::~allocator((allocator<char> *)&local_1159);
  std::__cxx11::string::~string((string *)&local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  clara::detail::Opt::~Opt(&local_10e8);
  clara::detail::Parser::~Parser(&local_a80);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator((allocator<char> *)&local_1019);
  clara::detail::Opt::~Opt(&local_ff8);
  clara::detail::Parser::~Parser(&local_ae0);
  std::__cxx11::string::~string((string *)&local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  std::__cxx11::string::~string((string *)&local_f50);
  std::allocator<char>::~allocator((allocator<char> *)&local_f51);
  std::__cxx11::string::~string((string *)&local_f28);
  std::allocator<char>::~allocator((allocator<char> *)&local_f29);
  clara::detail::Opt::~Opt(&local_f08);
  clara::detail::Parser::~Parser(&local_b40);
  std::__cxx11::string::~string((string *)&local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_e61);
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_e39);
  clara::detail::Opt::~Opt(&local_e18);
  clara::detail::Parser::~Parser(&local_ba0);
  std::__cxx11::string::~string((string *)&local_d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_d99);
  std::__cxx11::string::~string((string *)&local_d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_d49);
  clara::detail::Opt::~Opt(&local_d28);
  clara::detail::Parser::~Parser(&local_c00);
  clara::detail::Help::~Help(&local_ca0);
  clara::detail::ExeName::~ExeName(&local_c28);
  return __return_storage_ptr__;
}

Assistant:

clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace clara;

        auto const setWarning = [&]( std::string const& warning ) {
                auto warningSet = [&]() {
                    if( warning == "NoAssertions" )
                        return WarnAbout::NoAssertions;

                    if ( warning == "NoTests" )
                        return WarnAbout::NoTests;

                    return WarnAbout::Nothing;
                }();

                if (warningSet == WarnAbout::Nothing)
                    return ParserResult::runtimeError( "Unrecognised warning: '" + warning + "'" );
                config.warnings = static_cast<WarnAbout::What>( config.warnings | warningSet );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + "'" );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = RunTests::InDeclarationOrder;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = RunTests::InLexicographicalOrder;
                else if( startsWith( "random", order ) )
                    config.runOrder = RunTests::InRandomOrder;
                else
                    return clara::ParserResult::runtimeError( "Unrecognised ordering: '" + order + "'" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed != "time" )
                    return clara::detail::convertInto( seed, config.rngSeed );
                config.rngSeed = static_cast<unsigned int>( std::time(nullptr) );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setColourUsage = [&]( std::string const& useColour ) {
                    auto mode = toLower( useColour );

                    if( mode == "yes" )
                        config.useColour = UseColour::Yes;
                    else if( mode == "no" )
                        config.useColour = UseColour::No;
                    else if( mode == "auto" )
                        config.useColour = UseColour::Auto;
                    else
                        return ParserResult::runtimeError( "colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + "'" );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& reporter ) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower( reporter );
            auto result = factories.find( lcReporter );

            if( factories.end() != result )
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError( "Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters" );
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.listTests )
                ["-l"]["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["-t"]["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.outputFilename, "filename" )
                ["-o"]["--out"]
                ( "output filename" )
            | Opt( setReporter, "name" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTestNamesOnly )
                ["--list-test-names-only"]
                ( "list all/matching test cases names only" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all reporters" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setColourUsage, "yes|no" )
                ["--use-colour"]
                ( "should output be colourised" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }